

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,size_t length,bool emitUTF8)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint codepoint_1;
  uint codepoint;
  char *c;
  char *end;
  long local_88;
  size_type maxsize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_22;
  byte local_21;
  char *pcStack_20;
  bool emitUTF8_local;
  size_t length_local;
  char *value_local;
  String *result;
  
  local_21 = (byte)length & 1;
  pcStack_20 = value;
  length_local = (size_t)this;
  value_local = (char *)__return_storage_ptr__;
  if (this == (Json *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_22);
    std::allocator<char>::~allocator(&local_22);
  }
  else {
    bVar2 = doesAnyCharRequireEscaping((char *)this,(size_t)value);
    if (bVar2) {
      local_88 = (long)pcStack_20 * 2 + 3;
      end._7_1_ = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      c = pcStack_20 + length_local;
      for (_codepoint_1 = (byte *)length_local; _codepoint_1 != (byte *)c;
          _codepoint_1 = _codepoint_1 + 1) {
        bVar1 = *_codepoint_1;
        if (bVar1 == 8) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
        }
        else if (bVar1 == 9) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
        }
        else if (bVar1 == 10) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
        }
        else if (bVar1 == 0xc) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
        }
        else if (bVar1 == 0xd) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
        }
        else if (bVar1 == 0x22) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
        }
        else if (bVar1 == 0x5c) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
        }
        else if ((local_21 & 1) == 0) {
          uVar3 = utf8ToCodepoint((char **)&codepoint_1,c);
          if (uVar3 < 0x20) {
            appendHex(__return_storage_ptr__,uVar3);
          }
          else if (uVar3 < 0x80) {
            appendRaw(__return_storage_ptr__,uVar3);
          }
          else if (uVar3 < 0x10000) {
            appendHex(__return_storage_ptr__,uVar3);
          }
          else {
            appendHex(__return_storage_ptr__,uVar3 - 0x10000 >> 10 & 0x3ff | 0xd800);
            appendHex(__return_storage_ptr__,uVar3 - 0x10000 & 0x3ff | 0xdc00);
          }
        }
        else {
          uVar3 = (uint)*_codepoint_1;
          if (uVar3 < 0x20) {
            appendHex(__return_storage_ptr__,uVar3);
          }
          else {
            appendRaw(__return_storage_ptr__,uVar3);
          }
        }
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"\"",(allocator<char> *)((long)&maxsize + 7));
      std::operator+(&local_58,&local_78,(char *)length_local);
      std::operator+(__return_storage_ptr__,&local_58,"\"");
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&maxsize + 7));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static String valueToQuotedStringN(const char* value, size_t length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!doesAnyCharRequireEscaping(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        unsigned codepoint = static_cast<unsigned char>(*c);
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else {
          appendRaw(result, codepoint);
        }
      } else {
        unsigned codepoint = utf8ToCodepoint(c, end); // modifies `c`
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else if (codepoint < 0x80) {
          appendRaw(result, codepoint);
        } else if (codepoint < 0x10000) {
          // Basic Multilingual Plane
          appendHex(result, codepoint);
        } else {
          // Extended Unicode. Encode 20 bits as a surrogate pair.
          codepoint -= 0x10000;
          appendHex(result, 0xd800 + ((codepoint >> 10) & 0x3ff));
          appendHex(result, 0xdc00 + (codepoint & 0x3ff));
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}